

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O2

void __thiscall
CLineInput::DrawSelection(CLineInput *this,float HeightWeight,int Start,int End,vec4 Color)

{
  long lVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float fVar5;
  float fVar6;
  CTextBoundingBox CVar7;
  float local_a0;
  anon_union_4_2_94730227_for_vector4_base<float>_1 local_98;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aStack_94;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_88;
  anon_union_4_2_94730017_for_vector4_base<float>_7 aStack_84;
  CQuadItem aSelectionQuads [3];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (this->m_TextCursor).m_Align & 0xc;
  (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x13])(s_pTextRender,this,Start);
  (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x13])(s_pTextRender,this,(ulong)(uint)End);
  fVar5 = (this->m_TextCursor).m_NextLineAdvanceY / (float)(this->m_TextCursor).m_LineCount;
  if (uVar4 == 4) {
    local_a0 = fVar5 * 0.5;
  }
  else {
    if (uVar4 != 0) {
      local_a0 = (HeightWeight + 0.35000002) * fVar5 + -1.0;
      goto LAB_0017a4de;
    }
    local_a0 = -1.0;
  }
  local_a0 = local_a0 - (1.0 - HeightWeight) * fVar5;
LAB_0017a4de:
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x13])(s_pGraphics,0xffffffffffffffff);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_98 = Color.field_0;
  aStack_94 = Color.field_1;
  local_88 = Color.field_2;
  aStack_84 = Color.field_3;
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (local_98.x,aStack_94.y,local_88.z,aStack_84.w);
  if (extraout_XMM0_Db_00 <= extraout_XMM0_Db) {
    pp_Var2 = (s_pGraphics->super_IInterface)._vptr_IInterface;
    uVar3 = 1;
    fVar6 = extraout_XMM0_Da_00;
  }
  else {
    CVar7 = CTextCursor::BoundingBox(&this->m_TextCursor);
    aSelectionQuads[1].m_Width = CVar7.w;
    aSelectionQuads[1].m_X = CVar7.x;
    fVar6 = aSelectionQuads[1].m_X + aSelectionQuads[1].m_Width;
    aSelectionQuads[1].m_Y = (extraout_XMM0_Db - local_a0) + fVar5;
    if (extraout_XMM0_Db_00 - extraout_XMM0_Db <= fVar5) {
      aSelectionQuads[1].m_Width = extraout_XMM0_Da_00 - aSelectionQuads[1].m_X;
      uVar3 = 2;
      aSelectionQuads[1].m_Height = HeightWeight * fVar5;
    }
    else {
      aSelectionQuads[1].m_Height = (extraout_XMM0_Db_00 - extraout_XMM0_Db) - fVar5;
      aSelectionQuads[2].m_Y = aSelectionQuads[1].m_Height + aSelectionQuads[1].m_Y;
      aSelectionQuads[2].m_Width = extraout_XMM0_Da_00 - aSelectionQuads[1].m_X;
      uVar3 = 3;
      aSelectionQuads[2].m_X = aSelectionQuads[1].m_X;
      aSelectionQuads[2].m_Height = HeightWeight * fVar5;
    }
    pp_Var2 = (s_pGraphics->super_IInterface)._vptr_IInterface;
  }
  aSelectionQuads[0].m_Height = HeightWeight * fVar5;
  aSelectionQuads[0].m_Width = fVar6 - extraout_XMM0_Da;
  aSelectionQuads[0].m_Y = extraout_XMM0_Db - local_a0;
  (*pp_Var2[0x1d])(s_pGraphics,aSelectionQuads,uVar3);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLineInput::DrawSelection(float HeightWeight, int Start, int End, vec4 Color)
{
	const int VAlign = m_TextCursor.m_Align&TEXTALIGN_MASK_VERT;

	const vec2 StartPos = s_pTextRender->CaretPosition(&m_TextCursor, Start);
	const vec2 EndPos = s_pTextRender->CaretPosition(&m_TextCursor, End);
	const float LineHeight = m_TextCursor.BaseLineY()/m_TextCursor.LineCount();
	const float VAlignOffset =
		(VAlign == TEXTALIGN_TOP) ? -LineHeight*(1.0f-HeightWeight)-1.0f :
		(VAlign == TEXTALIGN_MIDDLE) ? -LineHeight*(1.0f-HeightWeight)+LineHeight/2 :
		/* TEXTALIGN_BOTTOM */ LineHeight*(1.35f-1.0f+HeightWeight)-1.0f;
	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();
	s_pGraphics->SetColor(Color);
	if(StartPos.y < EndPos.y) // multi line selection
	{
		CTextBoundingBox BoundingBox = m_TextCursor.BoundingBox();
		int NumQuads = 0;
		IGraphics::CQuadItem aSelectionQuads[3];
		aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(StartPos.x, StartPos.y - VAlignOffset, BoundingBox.Right() - StartPos.x, LineHeight*HeightWeight);
		const float SecondSegmentY = StartPos.y - VAlignOffset + LineHeight;
		if(EndPos.y - StartPos.y > LineHeight)
		{
			const float MiddleSegmentHeight = EndPos.y - StartPos.y - LineHeight;
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY, BoundingBox.w, MiddleSegmentHeight);
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY + MiddleSegmentHeight, EndPos.x - BoundingBox.x, LineHeight*HeightWeight);
		}
		else
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY, EndPos.x - BoundingBox.x, LineHeight*HeightWeight);
		s_pGraphics->QuadsDrawTL(aSelectionQuads, NumQuads);
	}
	else // single line selection
	{
		IGraphics::CQuadItem SelectionQuad(StartPos.x, StartPos.y - VAlignOffset, EndPos.x - StartPos.x, LineHeight*HeightWeight);
		s_pGraphics->QuadsDrawTL(&SelectionQuad, 1);
	}
	s_pGraphics->QuadsEnd();
}